

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

undefined8 __thiscall
OSTEI_HRR_Writer::HRRKetStepVar_(OSTEI_HRR_Writer *this,Doublet *d,string *brastr)

{
  char *in_RCX;
  int __c;
  Doublet *in_RDX;
  undefined8 in_RDI;
  string arrname;
  Doublet *in_stack_ffffffffffffff08;
  Doublet *in_stack_ffffffffffffff10;
  allocator local_a1;
  string local_a0 [8];
  char (*in_stack_ffffffffffffff68) [4];
  int *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [5];
  int *in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [2];
  string *in_stack_ffffffffffffffb8;
  Doublet *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  
  Doublet::Doublet(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  ArrVarName(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  Doublet::~Doublet((Doublet *)0x14a766);
  Doublet::ncart(in_stack_ffffffffffffff10);
  Doublet::index(in_RDX,in_RCX,__c);
  StringBuilder<char[5],std::__cxx11::string&,char_const(&)[9],int,char_const(&)[4],int,char_const(&)[2]>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::string OSTEI_HRR_Writer::HRRKetStepVar_(const Doublet & d, const std::string & brastr) const
{
    std::string arrname = ArrVarName(brastr, d);
    return StringBuilder("HRR_", arrname, "[ibra * ", d.ncart(), " + ", d.index(), "]"); 
}